

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfdcore_elements_address.cpp
# Opt level: O2

void __thiscall
cfd::core::ElementsConfidentialAddress::CalculateAddress
          (ElementsConfidentialAddress *this,Address *unblinded_address,
          ConfidentialKey *confidential_key)

{
  _Alloc_hider _Var1;
  bool bVar2;
  uint32_t uVar3;
  CfdException *pCVar4;
  char *extraout_RDX;
  char *extraout_RDX_00;
  char *extraout_RDX_01;
  char *extraout_RDX_02;
  char *wally_string;
  string *key;
  pointer pEVar5;
  int ret;
  pointer local_138;
  char *output;
  undefined1 local_128 [32];
  string hrp;
  AddressFormatData data;
  string address;
  vector<cfd::core::ElementsBlindAddressFormat,_std::allocator<cfd::core::ElementsBlindAddressFormat>_>
  local_90;
  _Vector_base<unsigned_char,_std::allocator<unsigned_char>_> local_78;
  vector<unsigned_char,_std::allocator<unsigned_char>_> *local_60;
  string *local_58;
  Address *local_50;
  
  bVar2 = Pubkey::IsValid(confidential_key);
  if (!bVar2) {
    hrp._M_dataplus._M_p = "cfdcore_elements_address.cpp";
    hrp._M_string_length = CONCAT44(hrp._M_string_length._4_4_,0xf0);
    hrp.field_2._M_allocated_capacity = (size_type)anon_var_dwarf_1fbb8b;
    Pubkey::GetHex_abi_cxx11_((string *)&data,confidential_key);
    Pubkey::GetData((ByteData *)&address,confidential_key);
    local_128._0_8_ = ByteData::GetDataSize((ByteData *)&address);
    logger::warn<std::__cxx11::string,unsigned_long>
              ((CfdSourceLocation *)&hrp,
               "CalculateAddress error. Confidential key is invalid. : confidential_key={}, size={}."
               ,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&data,
               (unsigned_long *)local_128);
    ::std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
              ((_Vector_base<unsigned_char,_std::allocator<unsigned_char>_> *)&address);
    ::std::__cxx11::string::~string((string *)&data);
    pCVar4 = (CfdException *)__cxa_allocate_exception(0x30);
    ::std::__cxx11::string::string
              ((string *)&data,"CalculateAddress error. Confidential key is invalid.",
               (allocator *)&hrp);
    CfdException::CfdException(pCVar4,kCfdIllegalArgumentError,(string *)&data);
    __cxa_throw(pCVar4,&CfdException::typeinfo,CfdException::~CfdException);
  }
  bVar2 = Pubkey::IsCompress(confidential_key);
  if (!bVar2) {
    hrp._M_dataplus._M_p = "cfdcore_elements_address.cpp";
    hrp._M_string_length = CONCAT44(hrp._M_string_length._4_4_,0xfb);
    hrp.field_2._M_allocated_capacity = (size_type)anon_var_dwarf_1fbb8b;
    Pubkey::GetHex_abi_cxx11_((string *)&data,confidential_key);
    Pubkey::GetData((ByteData *)&address,confidential_key);
    local_128._0_8_ = ByteData::GetDataSize((ByteData *)&address);
    logger::warn<std::__cxx11::string,unsigned_long>
              ((CfdSourceLocation *)&hrp,
               "CalculateAddress error. Confidential key is not compressed. : confidential_key={}, size={}."
               ,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&data,
               (unsigned_long *)local_128);
    ::std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
              ((_Vector_base<unsigned_char,_std::allocator<unsigned_char>_> *)&address);
    ::std::__cxx11::string::~string((string *)&data);
    pCVar4 = (CfdException *)__cxa_allocate_exception(0x30);
    ::std::__cxx11::string::string
              ((string *)&data,"CalculateAddress error. Confidential key is not compressed.",
               (allocator *)&hrp);
    CfdException::CfdException(pCVar4,kCfdIllegalArgumentError,(string *)&data);
    __cxa_throw(pCVar4,&CfdException::typeinfo,CfdException::~CfdException);
  }
  Pubkey::GetData((ByteData *)&data,confidential_key);
  ByteData::GetBytes((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&local_78,
                     (ByteData *)&data);
  ::std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
            ((_Vector_base<unsigned_char,_std::allocator<unsigned_char>_> *)&data);
  output = (char *)0x0;
  ret = -1;
  hrp._M_dataplus._M_p = (pointer)&hrp.field_2;
  hrp._M_string_length = 0;
  hrp.field_2._M_allocated_capacity = hrp.field_2._M_allocated_capacity & 0xffffffffffffff00;
  ::std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::_Rb_tree((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
              *)&data,(_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                       *)&unblinded_address->format_data_);
  core::Address::GetAddress_abi_cxx11_(&address,unblinded_address);
  local_50 = unblinded_address;
  GetBlindKeyPair();
  local_58 = (string *)&this->address_;
  local_60 = (vector<unsigned_char,_std::allocator<unsigned_char>_> *)&this->confidential_key_;
  key = &(local_90.
          super__Vector_base<cfd::core::ElementsBlindAddressFormat,_std::allocator<cfd::core::ElementsBlindAddressFormat>_>
          ._M_impl.super__Vector_impl_data._M_start)->blinded_prefix_key;
  pEVar5 = local_90.
           super__Vector_base<cfd::core::ElementsBlindAddressFormat,_std::allocator<cfd::core::ElementsBlindAddressFormat>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  while( true ) {
    if ((pointer)(key + -1) == pEVar5) {
      ::std::
      vector<cfd::core::ElementsBlindAddressFormat,_std::allocator<cfd::core::ElementsBlindAddressFormat>_>
      ::~vector(&local_90);
      local_128._0_8_ = "cfdcore_elements_address.cpp";
      local_128._8_4_ = 0x133;
      local_128._16_8_ = "CalculateAddress";
      logger::warn<std::__cxx11::string&>
                ((CfdSourceLocation *)local_128,
                 "CalculateAddress error. Address prefix not found. : address={}.",&address);
      pCVar4 = (CfdException *)__cxa_allocate_exception(0x30);
      ::std::__cxx11::string::string
                ((string *)local_128,"CalculateAddress address prefix not found.",
                 (allocator *)&local_90);
      CfdException::CfdException(pCVar4,kCfdIllegalArgumentError,(string *)local_128);
      __cxa_throw(pCVar4,&CfdException::typeinfo,CfdException::~CfdException);
    }
    output = (char *)0x0;
    if (*(char *)&key[1]._M_dataplus._M_p == '\x01') {
      local_138 = pEVar5;
      AddressFormatData::GetString((string *)local_128,&data,key);
      ::std::__cxx11::string::operator=((string *)&hrp,(string *)local_128);
      ::std::__cxx11::string::~string((string *)local_128);
      _Var1 = address._M_dataplus;
      AddressFormatData::GetString((string *)local_128,&data,key + -1);
      ret = wally_confidential_addr_from_addr_segwit
                      (_Var1._M_p,local_128._0_8_,hrp._M_dataplus._M_p,
                       local_78._M_impl.super__Vector_impl_data._M_start,
                       (long)local_78._M_impl.super__Vector_impl_data._M_finish -
                       (long)local_78._M_impl.super__Vector_impl_data._M_start,&output);
      ::std::__cxx11::string::~string((string *)local_128);
      wally_string = extraout_RDX;
      if (ret == 0) break;
      local_128._0_8_ = "cfdcore_elements_address.cpp";
      local_128._8_4_ = 0x118;
      local_128._16_8_ = "CalculateAddress";
      logger::trace<int&>((CfdSourceLocation *)local_128,"fail libwally. ret={}",&ret);
      wally_string = extraout_RDX_00;
      pEVar5 = local_138;
    }
    else {
      uVar3 = AddressFormatData::GetValue(&data,key);
      ret = wally_confidential_addr_from_addr
                      (address._M_dataplus._M_p,uVar3,
                       local_78._M_impl.super__Vector_impl_data._M_start,
                       (long)local_78._M_impl.super__Vector_impl_data._M_finish -
                       (long)local_78._M_impl.super__Vector_impl_data._M_start,&output);
      wally_string = extraout_RDX_01;
      if (ret == 0) break;
      local_128._0_8_ = "cfdcore_elements_address.cpp";
      local_128._8_4_ = 0x120;
      local_128._16_8_ = "CalculateAddress";
      logger::trace<int&>((CfdSourceLocation *)local_128,"fail libwally. ret={}",&ret);
      wally_string = extraout_RDX_02;
    }
    if (ret == 0) break;
    key = (string *)&key[2]._M_string_length;
  }
  WallyUtil::ConvertStringAndFree_abi_cxx11_((string *)local_128,(WallyUtil *)output,wally_string);
  ::std::__cxx11::string::operator=(local_58,(string *)local_128);
  ::std::__cxx11::string::~string((string *)local_128);
  ::std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator=
            (local_60,(vector<unsigned_char,_std::allocator<unsigned_char>_> *)confidential_key);
  core::Address::operator=(&this->unblinded_address_,local_50);
  ::std::
  vector<cfd::core::ElementsBlindAddressFormat,_std::allocator<cfd::core::ElementsBlindAddressFormat>_>
  ::~vector(&local_90);
  ::std::__cxx11::string::~string((string *)&address);
  ::std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::~_Rb_tree((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
               *)&data);
  ::std::__cxx11::string::~string((string *)&hrp);
  ::std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base(&local_78);
  return;
}

Assistant:

void ElementsConfidentialAddress::CalculateAddress(
    const Address& unblinded_address,
    const ConfidentialKey& confidential_key) {
  if (!confidential_key.IsValid()) {
    warn(
        CFD_LOG_SOURCE,
        "CalculateAddress error. Confidential key is invalid."
        " : confidential_key={}, size={}.",
        confidential_key.GetHex(), confidential_key.GetData().GetDataSize());
    throw CfdException(
        kCfdIllegalArgumentError,
        "CalculateAddress error. Confidential key is invalid.");
  }
  // 33bytes: ConfidentialKey
  if (!confidential_key.IsCompress()) {
    warn(
        CFD_LOG_SOURCE,
        "CalculateAddress error. Confidential key is not compressed."
        " : confidential_key={}, size={}.",
        confidential_key.GetHex(), confidential_key.GetData().GetDataSize());
    throw CfdException(
        kCfdIllegalArgumentError,
        "CalculateAddress error. Confidential key is not compressed.");
  }

  const std::vector<uint8_t>& pubkey_data =
      confidential_key.GetData().GetBytes();
  char* output = nullptr;

  int ret = -1;
  uint32_t prefix;
  std::string hrp;
  AddressFormatData data = unblinded_address.GetAddressFormatData();
  std::string address = unblinded_address.GetAddress();
  for (const auto& format : GetBlindKeyPair()) {
    try {
      output = nullptr;

      // Get confidential_key
      if (format.is_segwit) {
        hrp = data.GetString(format.blinded_prefix_key);
        ret = wally_confidential_addr_from_addr_segwit(
            address.c_str(), data.GetString(format.prefix_key).c_str(),
            hrp.c_str(), pubkey_data.data(), pubkey_data.size(), &output);
        if (ret != WALLY_OK) {
          trace(CFD_LOG_SOURCE, "fail libwally. ret={}", ret);
        }
      } else {
        prefix = data.GetValue(format.blinded_prefix_key);
        ret = wally_confidential_addr_from_addr(
            address.c_str(), prefix, pubkey_data.data(), pubkey_data.size(),
            &output);
        if (ret != WALLY_OK) {
          trace(CFD_LOG_SOURCE, "fail libwally. ret={}", ret);
        }
      }

      if (ret == WALLY_OK) {
        address_ = WallyUtil::ConvertStringAndFree(output);
        confidential_key_ = confidential_key;
        unblinded_address_ = unblinded_address;
        return;
      }
    } catch (const CfdException& except) {
      // Ignore
      trace(
          CFD_LOG_SOURCE, "CalculateAddress exception={}",
          std::string(except.what()));
    }
  }

  warn(
      CFD_LOG_SOURCE,
      "CalculateAddress error. Address prefix not found."
      " : address={}.",
      address);
  throw CfdException(
      kCfdIllegalArgumentError, "CalculateAddress address prefix not found.");
}